

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O1

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverTest_TestPackedField_Test::
TestBody(DescriptorPoolTypeResolverTest_TestPackedField_Test *this)

{
  TypeResolver *pTVar1;
  char cVar2;
  Field *pFVar3;
  Type *pTVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  AlphaNum *in_R8;
  char *in_R9;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  bool bVar5;
  Metadata MVar6;
  string_view name;
  string_view name_00;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__1;
  Type type;
  internal local_158 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  string local_148;
  string local_128;
  undefined1 local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  AlphaNum local_c8;
  StatusRep *local_98;
  Type local_90;
  
  Type::Type(&local_90,(Arena *)0x0);
  pTVar1 = (this->super_DescriptorPoolTypeResolverTest).resolver_._M_t.
           super___uniq_ptr_impl<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::TypeResolver_*,_std::default_delete<google::protobuf::util::TypeResolver>_>
           .super__Head_base<0UL,_google::protobuf::util::TypeResolver_*,_false>._M_head_impl;
  MVar6 = proto2_unittest::TestPackedTypes::GetMetadata
                    ((TestPackedTypes *)proto2_unittest::_TestPackedTypes_default_instance_);
  local_c8.piece_._M_str = ((MVar6.descriptor)->all_names_).payload_;
  local_c8.piece_._M_len = (size_t)*(ushort *)(local_c8.piece_._M_str + 2);
  local_c8.piece_._M_str = local_c8.piece_._M_str + ~local_c8.piece_._M_len;
  local_128._M_dataplus._M_p = &DAT_00000013;
  local_128._M_string_length = 0x1285da0;
  local_f8 = (undefined1  [8])0x1;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13ab429;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_148,(lts_20250127 *)&local_128,(AlphaNum *)local_f8,&local_c8,in_R8);
  pTVar4 = &local_90;
  (*pTVar1->_vptr_TypeResolver[2])(&local_98,pTVar1,&local_148);
  local_158[0] = (internal)(local_98 == (StatusRep *)0x1);
  local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((ulong)local_98 & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref(local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_150;
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_128,local_158,
               (AssertionResult *)
               "resolver_ ->ResolveMessageType( GetTypeUrl<proto2_unittest::TestPackedTypes>(), &type) .ok()"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x125,local_128._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    __ptr_00 = local_150;
    if (local_f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_f8 + 8))();
      __ptr_00 = local_150;
    }
  }
  else {
    if (local_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,local_150);
    }
    name._M_str = (char *)pTVar4;
    name._M_len = (size_t)"packed_int32";
    pFVar3 = FindField((anon_unknown_0 *)&local_90,(Type *)&DAT_0000000c,name);
    if (((pFVar3 == (Field *)0x0) || ((pFVar3->field_0)._impl_.cardinality_ != 3)) ||
       ((pFVar3->field_0)._impl_.kind_ != 5)) {
      bVar5 = false;
    }
    else {
      bVar5 = (pFVar3->field_0)._impl_.number_ == 0x5a;
    }
    local_f8[0] = bVar5;
    local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar5 == false) {
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_128,(internal *)local_f8,
                 (AssertionResult *)
                 "HasField(type, Field::CARDINALITY_REPEATED, Field::TYPE_INT32, \"packed_int32\", 90)"
                 ,"false","true",in_R9);
      pTVar4 = (Type *)0x127;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x127,local_128._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((long *)local_c8.piece_._M_len != (long *)0x0) {
        (**(code **)(*(long *)local_c8.piece_._M_len + 8))();
      }
    }
    if (local_f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_f0,local_f0);
    }
    name_00._M_str = (char *)pTVar4;
    name_00._M_len = (size_t)"packed_int32";
    pFVar3 = FindField((anon_unknown_0 *)&local_90,(Type *)&DAT_0000000c,name_00);
    if (pFVar3 == (Field *)0x0) {
      cVar2 = '\0';
    }
    else {
      cVar2 = (pFVar3->field_0)._impl_.packed_;
    }
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_f0;
    local_f8[0] = cVar2;
    local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    __ptr_00 = local_f0;
    if (cVar2 == '\0') {
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_128,(internal *)local_f8,
                 (AssertionResult *)"IsPacked(type, \"packed_int32\")","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x128,local_128._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      __ptr_00 = local_f0;
      if ((long *)local_c8.piece_._M_len != (long *)0x0) {
        (**(code **)(*(long *)local_c8.piece_._M_len + 8))();
        __ptr_00 = local_f0;
      }
    }
  }
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(this_00,__ptr_00);
  }
  Type::~Type(&local_90);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverTest, TestPackedField) {
  Type type;
  ASSERT_TRUE(resolver_
                  ->ResolveMessageType(
                      GetTypeUrl<proto2_unittest::TestPackedTypes>(), &type)
                  .ok());
  EXPECT_TRUE(HasField(type, Field::CARDINALITY_REPEATED, Field::TYPE_INT32,
                       "packed_int32", 90));
  EXPECT_TRUE(IsPacked(type, "packed_int32"));
}